

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

bool __thiscall
QSocks5SocketEngine::joinMulticastGroup
          (QSocks5SocketEngine *this,QHostAddress *param_2,QNetworkInterface *param_3)

{
  long lVar1;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  size_t in_stack_ffffffffffffffb0;
  QString *errorString;
  char *in_stack_ffffffffffffffb8;
  undefined1 auVar3 [12];
  QLatin1StringView in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = Qt::Literals::StringLiterals::operator____L1
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  auVar3 = QVar2._4_12_;
  errorString = (QString *)&stack0xffffffffffffffe0;
  QString::QString((QString *)QVar2.m_data,in_stack_ffffffffffffffe0);
  QAbstractSocketEngine::setError(auVar3._4_8_,auVar3._0_4_,errorString);
  QString::~QString((QString *)0x37429f);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5SocketEngine::joinMulticastGroup(const QHostAddress &,
                                             const QNetworkInterface &)
{
    setError(QAbstractSocket::UnsupportedSocketOperationError,
             "Operation on socket is not supported"_L1);
    return false;
}